

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O0

void libtorrent::aux::uninitialized_default_construct<bool*>(bool *first,bool *last)

{
  bool *local_20;
  bool *current;
  bool *last_local;
  bool *first_local;
  
  for (local_20 = first; local_20 != last; local_20 = local_20 + 1) {
  }
  return;
}

Assistant:

inline void uninitialized_default_construct(ForwardIt first, ForwardIt last)
{
	using Value = typename std::iterator_traits<ForwardIt>::value_type;
	ForwardIt current = first;
	try {
		for (; current != last; ++current) {
			::new (static_cast<void*>(std::addressof(*current))) Value;
		}
	}  catch (...) {
		for (; first != current; ++first) {
			first->~Value();
		}
		throw;
	}
}